

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  ~IfcSIUnit((IfcSIUnit *)
             ((long)&(this->super_IfcNamedUnit).
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
                     _vptr_ObjectHelper +
             (long)(this->super_IfcNamedUnit).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper
                   [-3]));
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}